

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ldi_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,int32_t s10)

{
  long lVar1;
  uint local_2c;
  uint32_t i;
  wr_t *pwd;
  int32_t s10_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict5 *env_local;
  
  lVar1 = (ulong)wd * 0x10 + 0x338;
  switch(df) {
  case 0:
    for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
      *(char *)((long)(env->active_fpu).fpr + (ulong)local_2c + lVar1 + -0x338) = (char)s10;
    }
    break;
  case 1:
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      *(short *)((long)(env->active_fpu).fpr + (ulong)local_2c * 2 + lVar1 + -0x338) = (short)s10;
    }
    break;
  case 2:
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      *(int32_t *)((long)(env->active_fpu).fpr + (ulong)local_2c * 4 + lVar1 + -0x338) = s10;
    }
    break;
  case 3:
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      *(long *)((long)(env->active_fpu).fpr + (ulong)local_2c * 8 + lVar1 + -0x338) = (long)s10;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x118b,
                  "void helper_msa_ldi_df_mips64(CPUMIPSState *, uint32_t, uint32_t, int32_t)");
  }
  return;
}

Assistant:

void helper_msa_ldi_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       int32_t s10)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = (int8_t)s10;
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = (int16_t)s10;
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = (int32_t)s10;
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = (int64_t)s10;
        }
       break;
    default:
        assert(0);
    }
}